

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O0

void Corrade::Utility::Implementation::flipSecondToLastDimensionInPlace
               (StridedArrayView3D<char> *view)

{
  type this;
  type this_00;
  char *data;
  StridedArrayView4D<char> *in_stack_00000048;
  Stride<4U> local_b8;
  Size<4U> local_98;
  ArrayView<char> local_78;
  StridedArrayView<4U,_char> local_68;
  long *local_20;
  ptrdiff_t *stride;
  size_t *size;
  StridedArrayView3D<char> *view_local;
  
  size = (size_t *)view;
  this = Containers::StridedArrayView<3U,_char>::size(view);
  stride = (ptrdiff_t *)Containers::StridedDimensions<3U,_unsigned_long>::begin(this);
  this_00 = Containers::StridedArrayView<3U,_char>::stride((StridedArrayView<3U,_char> *)size);
  local_20 = Containers::StridedDimensions<3U,_long>::begin(this_00);
  data = (char *)Containers::StridedArrayView<3U,_char>::data((StridedArrayView<3U,_char> *)size);
  Containers::ArrayView<char>::ArrayView(&local_78,data,0xffffffffffffffff);
  Containers::StridedDimensions<4u,unsigned_long>::
  StridedDimensions<unsigned_long,unsigned_long,unsigned_long>
            ((StridedDimensions<4u,unsigned_long> *)&local_98,1,*stride,stride[1],stride[2]);
  Containers::StridedDimensions<4u,long>::StridedDimensions<long,long,long>
            ((StridedDimensions<4u,long> *)&local_b8,*local_20,*local_20,local_20[1],local_20[2]);
  Containers::StridedArrayView<4U,_char>::StridedArrayView(&local_68,local_78,&local_98,&local_b8);
  flipSecondToLastDimensionInPlace(in_stack_00000048);
  return;
}

Assistant:

void flipSecondToLastDimensionInPlace(const Containers::StridedArrayView3D<char>& view) {
    const std::size_t* size = view.size().begin();
    const std::ptrdiff_t* stride = view.stride().begin();
    /* Using ~std::size_t{} for arrayview size as a shortcut -- there it's just
       for the size assert anyway */
    return flipSecondToLastDimensionInPlace(Containers::StridedArrayView4D<char>{
        {static_cast<char*>(view.data()), ~std::size_t{}},
        {1, size[0], size[1], size[2]},
        {stride[0], stride[0], stride[1], stride[2]}
    });
}